

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O3

void __thiscall ProcessProgress::begin_heartbeat(ProcessProgress *this)

{
  int iVar1;
  itimerspec spec;
  undefined1 local_34 [12];
  itimerspec local_28;
  
  close_and_remove_epoll_entry(&this->watchdog_timer_fd);
  iVar1 = timerfd_create(1,0x80000);
  this->watchdog_timer_fd = iVar1;
  if (iVar1 < 0) {
    begin_heartbeat();
  }
  else {
    local_28.it_value.tv_nsec = 0;
    local_28.it_interval.tv_sec = 0;
    local_28.it_interval.tv_nsec = 0;
    local_28.it_value.tv_sec = 10;
    iVar1 = timerfd_settime(iVar1,0,&local_28,(itimerspec *)0x0);
    if (iVar1 < 0) {
      begin_heartbeat();
    }
    local_34._8_4_ = 0;
    local_34._4_4_ = this->index | 0x40000000;
    local_34._0_4_ = 1;
    iVar1 = epoll_ctl(Global::epoll_fd,1,this->watchdog_timer_fd,(epoll_event *)local_34);
    if (iVar1 != 0) {
      begin_heartbeat();
    }
  }
  return;
}

Assistant:

void ProcessProgress::begin_heartbeat()
{
	close_and_remove_epoll_entry(watchdog_timer_fd);
	watchdog_timer_fd = timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC);

	if (watchdog_timer_fd >= 0)
	{
		struct itimerspec spec = {};
		spec.it_value.tv_sec = 10;
		if (timerfd_settime(watchdog_timer_fd, 0, &spec, nullptr) < 0)
			LOGE("Failed to set time with timerfd_settime.\n");

		struct epoll_event event = {};
		event.data.u32 = 0x40000000u | index;
		event.events = EPOLLIN;
		if (epoll_ctl(Global::epoll_fd, EPOLL_CTL_ADD, watchdog_timer_fd, &event))
			LOGE("Failed adding timer_fd to epoll_ctl().\n");
	}
	else
		LOGE("Failed to create timerfd. Cannot support timeout for process.\n");
}